

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::TableBeginCell(ImGuiTable *table,int column_n)

{
  ImVec4 *pIVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImGuiTableColumn *pIVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  
  if ((column_n < 0) ||
     (pIVar8 = (table->Columns).Data + column_n, (table->Columns).DataEnd <= pIVar8)) {
    __assert_fail("p >= Data && p < DataEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_internal.h"
                  ,0x20b,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
  }
  pIVar3 = table->InnerWindow;
  table->CurrentColumn = column_n;
  fVar2 = pIVar8->WorkMinX;
  fVar11 = fVar2;
  if ((pIVar8->Flags & 0x8000) != 0) {
    fVar11 = table->RowIndentOffsetX + fVar2;
  }
  (pIVar3->DC).CursorPos.x = fVar11;
  fVar10 = table->RowPosY1 + table->CellPaddingY;
  (pIVar3->DC).CursorPos.y = fVar10;
  (pIVar3->DC).CursorMaxPos.x = fVar11;
  (pIVar3->DC).ColumnsOffset.x = (fVar11 - (pIVar3->Pos).x) - (pIVar3->DC).Indent.x;
  (pIVar3->DC).CurrLineTextBaseOffset = table->RowTextBaseline;
  (pIVar3->DC).LastItemId = 0;
  (pIVar3->DC).NavLayerCurrent = (int)pIVar8->NavLayerCurrent;
  (pIVar3->WorkRect).Min.y = fVar10;
  (pIVar3->WorkRect).Min.x = fVar2;
  (pIVar3->WorkRect).Max.x = pIVar8->WorkMaxX;
  (pIVar3->DC).ItemWidth = pIVar8->ItemWidth;
  if (pIVar8->IsEnabled == false) {
    uVar9 = -(uint)(table->RowPosY2 <= fVar10);
    (pIVar3->DC).CursorPos.y = (float)(~uVar9 & (uint)table->RowPosY2 | (uint)fVar10 & uVar9);
  }
  pIVar3->SkipItems = pIVar8->IsSkipItems;
  if ((table->Flags & 0x100000) == 0) {
    IVar5 = (pIVar8->ClipRect).Min;
    IVar6 = (pIVar8->ClipRect).Max;
    IVar7 = (pIVar8->ClipRect).Max;
    (pIVar3->ClipRect).Min = (pIVar8->ClipRect).Min;
    (pIVar3->ClipRect).Max = IVar7;
    pIVar4 = pIVar3->DrawList;
    (pIVar4->_CmdHeader).ClipRect.x = IVar5.x;
    (pIVar4->_CmdHeader).ClipRect.y = IVar5.y;
    (pIVar4->_CmdHeader).ClipRect.z = IVar6.x;
    (pIVar4->_CmdHeader).ClipRect.w = IVar6.y;
    pIVar1 = (pIVar3->DrawList->_ClipRectStack).Data +
             (long)(pIVar3->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = IVar5.x;
    pIVar1->y = IVar5.y;
    pIVar1->z = IVar6.x;
    pIVar1->w = IVar6.y;
    ImDrawListSplitter::SetCurrentChannel
              (&table->DrawSplitter,pIVar3->DrawList,(uint)pIVar8->DrawChannelCurrent);
    return;
  }
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar3->DrawList,2);
  return;
}

Assistant:

inline T&           operator[](int i)           { T* p = Data + i; IM_ASSERT(p >= Data && p < DataEnd); return *p; }